

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-itr.c
# Opt level: O3

void rtosc_arg_val_itr_next(rtosc_arg_val_itr *itr)

{
  int32_t iVar1;
  size_t sVar2;
  rtosc_arg_val_t *prVar3;
  int iVar4;
  
  if (itr->av->type == '-') {
    iVar4 = itr->range_i + 1;
    itr->range_i = iVar4;
    iVar1 = rtosc_av_rep_num(itr->av);
    if (iVar1 <= iVar4) {
      iVar1 = rtosc_av_rep_num(itr->av);
      if (iVar1 != 0) {
        iVar1 = rtosc_av_rep_has_delta(itr->av);
        prVar3 = itr->av;
        if (iVar1 == 0) {
          sVar2 = itr->i;
        }
        else {
          prVar3 = prVar3 + 1;
          sVar2 = itr->i + 1;
        }
        itr->av = prVar3 + 1;
        itr->i = sVar2 + 1;
        itr->range_i = 0;
      }
    }
  }
  if (itr->range_i == 0) {
    prVar3 = itr->av;
    if (prVar3->type == 'a') {
      iVar1 = rtosc_av_arr_len(prVar3);
      itr->i = itr->i + (long)iVar1;
      iVar1 = rtosc_av_arr_len(itr->av);
      prVar3 = itr->av + iVar1;
    }
    itr->i = itr->i + 1;
    itr->av = prVar3 + 1;
  }
  return;
}

Assistant:

void rtosc_arg_val_itr_next(rtosc_arg_val_itr *itr)
{
    // increase the range index
    if(itr->av->type == '-')
    {
        // increase if the limit was reached, and the limit was not infinity (=0)
        if(++itr->range_i >= rtosc_av_rep_num(itr->av) && rtosc_av_rep_num(itr->av))
        {
            if(rtosc_av_rep_has_delta(itr->av))
            {
                ++itr->av;
                ++itr->i;
            }
            ++itr->av;
            ++itr->i;
            itr->range_i = 0;
        }
    }

    // if not inside a range (or at its beginning), increase the index
    if(!itr->range_i)
    {
        if(itr->av->type == 'a')
        {
            itr->i += rtosc_av_arr_len(itr->av);
            itr->av += rtosc_av_arr_len(itr->av);
        }
        ++itr->i;
        ++itr->av;
    }
}